

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::to_func_call_arg_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,Parameter *param_1,uint32_t id)

{
  uint32_t uVar1;
  Variant *pVVar2;
  bool bVar3;
  SPIRType *type;
  ulong uVar4;
  SPIRVariable *pSVar5;
  
  type = Compiler::expression_type(&this->super_Compiler,id);
  bVar3 = Compiler::is_physical_pointer(&this->super_Compiler,type);
  if (bVar3) {
    to_pointer_expression_abi_cxx11_(__return_storage_ptr__,this,id,true);
  }
  else {
    uVar4 = (ulong)id;
    if ((uVar4 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size)
       && (pVVar2 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
          pVVar2[uVar4].type == TypeVariable)) {
      pSVar5 = Variant::get<spirv_cross::SPIRVariable>(pVVar2 + uVar4);
      uVar1 = (pSVar5->basevariable).id;
      if (uVar1 != 0) {
        id = uVar1;
      }
    }
    to_unpacked_expression_abi_cxx11_(__return_storage_ptr__,this,id,true);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_func_call_arg(const SPIRFunction::Parameter &, uint32_t id)
{
	// BDA expects pointers through function interface.
	if (is_physical_pointer(expression_type(id)))
		return to_pointer_expression(id);

	// Make sure that we use the name of the original variable, and not the parameter alias.
	uint32_t name_id = id;
	auto *var = maybe_get<SPIRVariable>(id);
	if (var && var->basevariable)
		name_id = var->basevariable;
	return to_unpacked_expression(name_id);
}